

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_file_stat(char *fname,int follow_links,os_file_stat_t *s)

{
  __uid_t _Var1;
  int iVar2;
  int iVar3;
  __gid_t _Var4;
  char *pcVar5;
  pointer puVar6;
  type puVar7;
  undefined4 *in_RDX;
  int in_ESI;
  char *in_RDI;
  bool bVar8;
  int i;
  __array groups;
  int grpSize;
  stat buf;
  size_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  __gid_t in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff18;
  int local_dc;
  int local_d8;
  stat local_b0;
  undefined4 *local_20;
  int local_4;
  
  local_20 = in_RDX;
  if (in_ESI == 0) {
    local_dc = lstat(in_RDI,&local_b0);
  }
  else {
    local_dc = stat(in_RDI,&local_b0);
  }
  if (local_dc == 0) {
    *local_20 = (int)local_b0.st_size;
    local_20[1] = (int)((ulong)local_b0.st_size >> 0x20);
    *(__time_t *)(local_20 + 2) = local_b0.st_ctim.tv_sec;
    *(__time_t *)(local_20 + 4) = local_b0.st_mtim.tv_sec;
    *(__time_t *)(local_20 + 6) = local_b0.st_atim.tv_sec;
    *(ulong *)(local_20 + 8) = (ulong)local_b0.st_mode;
    *(undefined8 *)(local_20 + 10) = 0;
    pcVar5 = os_get_root_name((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
    if (*pcVar5 == '.') {
      *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 1;
    }
    _Var1 = geteuid();
    if (_Var1 == local_b0.st_uid) {
      if ((local_b0.st_mode & 0x100) != 0) {
        *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 4;
      }
      if ((local_b0.st_mode & 0x80) != 0) {
        *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 8;
      }
      local_4 = 1;
    }
    else {
      iVar2 = getgroups(0,(__gid_t *)0x0);
      iVar3 = iVar2 + 1;
      if ((iVar3 < 0x10001) && (-1 < iVar3)) {
        std::make_unique<unsigned_int[]>(in_stack_ffffffffffffff18);
        puVar6 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                           ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        iVar2 = getgroups(iVar2,puVar6 + 1);
        if (iVar2 < 0) {
          local_4 = 0;
        }
        else {
          _Var4 = getegid();
          puVar7 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8);
          *puVar7 = _Var4;
          local_d8 = 0;
          while( true ) {
            bVar8 = false;
            if (local_d8 < iVar3) {
              in_stack_ffffffffffffff04 = local_b0.st_gid;
              puVar7 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                       operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                   *)CONCAT44(local_b0.st_gid,in_stack_ffffffffffffff00),
                                  in_stack_fffffffffffffef8);
              bVar8 = in_stack_ffffffffffffff04 != *puVar7;
            }
            if (!bVar8) break;
            local_d8 = local_d8 + 1;
          }
          if (local_d8 < iVar3) {
            if ((local_b0.st_mode & 0x20) != 0) {
              *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 4;
            }
            if ((local_b0.st_mode & 0x10) != 0) {
              *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 8;
            }
            local_4 = 1;
          }
          else {
            if ((local_b0.st_mode & 4) != 0) {
              *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 4;
            }
            if ((local_b0.st_mode & 2) != 0) {
              *(ulong *)(local_20 + 10) = *(ulong *)(local_20 + 10) | 8;
            }
            local_4 = 1;
          }
        }
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
os_file_stat( const char *fname, int follow_links, os_file_stat_t *s )
{
    struct stat buf;
    if ((follow_links ? stat(fname, &buf) : lstat(fname, &buf)) != 0)
        return false;

    s->sizelo = (uint32_t)(buf.st_size & 0xFFFFFFFF);
    s->sizehi = sizeof(buf.st_size) > 4
                ? (uint32_t)((buf.st_size >> 32) & 0xFFFFFFFF)
                : 0;
    s->cre_time = buf.st_ctime;
    s->mod_time = buf.st_mtime;
    s->acc_time = buf.st_atime;
    s->mode = buf.st_mode;
    s->attrs = 0;

    if (os_get_root_name(fname)[0] == '.') {
        s->attrs |= OSFATTR_HIDDEN;
    }

    // If we're the owner, check if we have read/write access.
    if (geteuid() == buf.st_uid) {
        if (buf.st_mode & S_IRUSR)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWUSR)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // Check if one of our groups matches the file's group and if so, check
    // for read/write access.

    // Also reserve a spot for the effective group ID, which might
    // not be included in the list in our next call.
    int grpSize = getgroups(0, NULL) + 1;
    // Paranoia.
    if (grpSize > NGROUPS_MAX or grpSize < 0)
        return false;

    const auto groups = std::make_unique<gid_t[]>(grpSize);
    if (getgroups(grpSize - 1, groups.get() + 1) < 0) {
        return false;
    }
    groups[0] = getegid();
    int i;
    for (i = 0; i < grpSize and buf.st_gid != groups[i]; ++i)
        ;
    if (i < grpSize) {
        if (buf.st_mode & S_IRGRP)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWGRP)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // We're neither the owner of the file nor do we belong to its
    // group.  Check whether the file is world readable/writable.
    if (buf.st_mode & S_IROTH)
        s->attrs |= OSFATTR_READ;
    if (buf.st_mode & S_IWOTH)
        s->attrs |= OSFATTR_WRITE;
    return true;
}